

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::PrimitiveBoundingBoxTests::init
          (PrimitiveBoundingBoxTests *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  DepthType DVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  Context *pCVar9;
  int extraout_EAX;
  TestNode *pTVar10;
  TestNode *pTVar11;
  TestNode *pTVar12;
  BBoxRenderCase *this_00;
  ulong uVar13;
  long lVar14;
  long lVar15;
  uint numIterations;
  deUint32 in_R9D;
  long lVar16;
  bool bVar17;
  
  pTVar10 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar10,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"state_query",
             "State queries");
  tcu::TestNode::addChild((TestNode *)this,pTVar10);
  pTVar11 = (TestNode *)operator_new(0x78);
  pCVar9 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar11,pCVar9->m_testCtx,"initial_value","Initial value case");
  pTVar11[1]._vptr_TestNode = (_func_int **)pCVar9;
  pTVar11->_vptr_TestNode = (_func_int **)&PTR__TestCase_021b7e28;
  tcu::TestNode::addChild(pTVar10,pTVar11);
  pTVar11 = (TestNode *)operator_new(0x80);
  pCVar9 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase((TestCase *)pTVar11,pCVar9->m_testCtx,"getfloat","getFloatv");
  pTVar11[1]._vptr_TestNode = (_func_int **)pCVar9;
  pTVar11->_vptr_TestNode = (_func_int **)&PTR__TestCase_021b7e78;
  *(undefined4 *)&pTVar11[1].m_testCtx = 0;
  tcu::TestNode::addChild(pTVar10,pTVar11);
  pTVar11 = (TestNode *)operator_new(0x80);
  pCVar9 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase((TestCase *)pTVar11,pCVar9->m_testCtx,"getboolean","getBooleanv");
  pTVar11[1]._vptr_TestNode = (_func_int **)pCVar9;
  pTVar11->_vptr_TestNode = (_func_int **)&PTR__TestCase_021b7e78;
  *(undefined4 *)&pTVar11[1].m_testCtx = 1;
  tcu::TestNode::addChild(pTVar10,pTVar11);
  pTVar11 = (TestNode *)operator_new(0x80);
  pCVar9 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase((TestCase *)pTVar11,pCVar9->m_testCtx,"getinteger","getIntegerv");
  pTVar11[1]._vptr_TestNode = (_func_int **)pCVar9;
  pTVar11->_vptr_TestNode = (_func_int **)&PTR__TestCase_021b7e78;
  *(undefined4 *)&pTVar11[1].m_testCtx = 2;
  tcu::TestNode::addChild(pTVar10,pTVar11);
  pTVar11 = (TestNode *)operator_new(0x80);
  pCVar9 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase((TestCase *)pTVar11,pCVar9->m_testCtx,"getinteger64","getInteger64v");
  pTVar11[1]._vptr_TestNode = (_func_int **)pCVar9;
  pTVar11->_vptr_TestNode = (_func_int **)&PTR__TestCase_021b7e78;
  *(undefined4 *)&pTVar11[1].m_testCtx = 3;
  tcu::TestNode::addChild(pTVar10,pTVar11);
  lVar15 = 0;
  do {
    pTVar10 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar10,
               (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               (char *)(&DAT_021b7cf0)[lVar15 * 3],
               (&PTR_anon_var_dwarf_40048b8_021b7cf8)[lVar15 * 3]);
    tcu::TestNode::addChild((TestNode *)this,pTVar10);
    lVar14 = 0;
    do {
      pTVar11 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar11,
                 (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                 init::stateSetMethods[lVar14].name,init::stateSetMethods[lVar14].description);
      tcu::TestNode::addChild(pTVar10,pTVar11);
      uVar1 = init::stateSetMethods[lVar14].methodFlags;
      uVar13 = 0;
      do {
        if (((uVar13 & 1) != 0) || ((uVar1 & 0x100) == 0)) {
          pTVar12 = (TestNode *)operator_new(0x70);
          tcu::TestCaseGroup::TestCaseGroup
                    ((TestCaseGroup *)pTVar12,
                     (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                     init::pipelineConfigs[uVar13].name,init::pipelineConfigs[uVar13].description);
          tcu::TestNode::addChild(pTVar11,pTVar12);
          uVar2 = (&DAT_021b7d04)[lVar15 * 6];
          uVar3 = init::pipelineConfigs[uVar13].stageFlags;
          lVar16 = 0;
          do {
            numIterations =
                 *(uint *)((long)&init::usageConfigs[0].flags + lVar16) | uVar2 | uVar3 | uVar1;
            uVar4 = *(uint *)((long)&init::usageConfigs[0].invalidFlags + lVar16);
            if (((uVar4 == 0) || ((uVar4 & numIterations) == 0)) &&
               ((uVar4 = *(uint *)((long)&init::usageConfigs[0].requiredFlags + lVar16), uVar4 == 0
                || ((uVar4 & numIterations) != 0)))) {
              iVar5 = (&DAT_021b7d00)[lVar15 * 6];
              if (iVar5 == 2) {
                this_00 = (BBoxRenderCase *)operator_new(0xf8);
                anon_unknown_1::BBoxRenderCase::BBoxRenderCase
                          (this_00,(this->super_TestCaseGroup).m_context,
                           *(char **)((long)&init::usageConfigs[0].name + lVar16),
                           *(char **)((long)&init::usageConfigs[0].description + lVar16),
                           numIterations,in_R9D);
                (this_00->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
                     (_func_int **)&PTR__PointRenderCase_021b8090;
                *(undefined4 *)&this_00->field_0xd4 = 4;
                *(byte *)&this_00[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
                     (byte)(numIterations >> 10) & 1;
                this_00[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx =
                     (TestContext *)0x0;
                this_00[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p =
                     (pointer)0x0;
                this_00[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length = 0;
              }
              else if (iVar5 == 1) {
                this_00 = (BBoxRenderCase *)operator_new(0xe0);
                anon_unknown_1::BBoxRenderCase::BBoxRenderCase
                          (this_00,(this->super_TestCaseGroup).m_context,
                           *(char **)((long)&init::usageConfigs[0].name + lVar16),
                           *(char **)((long)&init::usageConfigs[0].description + lVar16),
                           numIterations,in_R9D);
                (this_00->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
                     (_func_int **)&PTR__BBoxRenderCase_021b7ff8;
                *(undefined4 *)&this_00->field_0xd4 = 0xc;
                *(byte *)&this_00[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
                     (byte)(numIterations >> 10) & 1;
                *(undefined4 *)
                 ((long)&this_00[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4)
                     = 5;
              }
              else {
                if (iVar5 != 0) goto LAB_01674509;
                this_00 = (BBoxRenderCase *)operator_new(0xd8);
                anon_unknown_1::BBoxRenderCase::BBoxRenderCase
                          (this_00,(this->super_TestCaseGroup).m_context,
                           *(char **)((long)&init::usageConfigs[0].name + lVar16),
                           *(char **)((long)&init::usageConfigs[0].description + lVar16),
                           numIterations,in_R9D);
                (this_00->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
                     (_func_int **)&PTR__BBoxRenderCase_021b7ec8;
                *(undefined4 *)&this_00->field_0xd4 = 0x18;
              }
              tcu::TestNode::addChild(pTVar12,(TestNode *)this_00);
            }
LAB_01674509:
            lVar16 = lVar16 + 0x20;
          } while (lVar16 != 0x100);
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 != 4);
      lVar14 = lVar14 + 1;
    } while (lVar14 != 3);
    lVar15 = lVar15 + 1;
    if (lVar15 == 5) {
      pTVar10 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar10,
                 (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"depth",
                 "Test bounding box depth component");
      tcu::TestNode::addChild((TestNode *)this,pTVar10);
      lVar15 = 0;
      do {
        pTVar11 = (TestNode *)operator_new(0x70);
        tcu::TestCaseGroup::TestCaseGroup
                  ((TestCaseGroup *)pTVar11,
                   (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                   init::depthMethods[lVar15].name,init::depthMethods[lVar15].description);
        tcu::TestNode::addChild(pTVar10,pTVar11);
        lVar14 = 0x14;
        do {
          pTVar12 = (TestNode *)operator_new(200);
          pCVar9 = (this->super_TestCaseGroup).m_context;
          DVar6 = init::depthMethods[lVar15].depthMethod;
          uVar7 = *(undefined4 *)(&init::depthMethods[1].field_0x14 + lVar14);
          uVar8 = *(undefined4 *)((long)&init::depthCases[0].name + lVar14);
          tcu::TestCase::TestCase
                    ((TestCase *)pTVar12,pCVar9->m_testCtx,
                     *(char **)((long)&init::depthMethods[1].name + lVar14 + 4),
                     *(char **)((long)&init::depthMethods[1].description + lVar14 + 4));
          pTVar12[1]._vptr_TestNode = (_func_int **)pCVar9;
          pTVar12->_vptr_TestNode = (_func_int **)&PTR__DepthDrawCase_021b8128;
          pTVar12[1].m_testCtx = (TestContext *)0x180000000e;
          *(DepthType *)&pTVar12[1].m_name._M_dataplus._M_p = DVar6;
          *(undefined4 *)((long)&pTVar12[1].m_name._M_dataplus._M_p + 4) = uVar7;
          *(undefined4 *)&pTVar12[1].m_name._M_string_length = uVar8;
          pTVar12[1].m_name.field_2._M_allocated_capacity = 0;
          pTVar12[1].m_description._M_dataplus._M_p = (pointer)0x0;
          pTVar12[1].m_description.field_2._M_allocated_capacity = 0;
          *(undefined8 *)((long)&pTVar12[1].m_description.field_2 + 8) = 0;
          *(undefined8 *)&pTVar12[1].m_nodeType = 0;
          tcu::TestNode::addChild(pTVar11,pTVar12);
          lVar14 = lVar14 + 0x18;
        } while (lVar14 != 0x74);
        bVar17 = lVar15 == 0;
        lVar15 = lVar15 + 1;
      } while (bVar17);
      pTVar10 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar10,
                 (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"blit_fbo"
                 ,"Test bounding box does not affect blitting");
      tcu::TestNode::addChild((TestNode *)this,pTVar10);
      pTVar11 = (TestNode *)operator_new(0x100);
      pCVar9 = (this->super_TestCaseGroup).m_context;
      tcu::TestCase::TestCase
                ((TestCase *)pTVar11,pCVar9->m_testCtx,"blit_default_to_fbo",
                 "Blit from default fb to fbo");
      pTVar11[1]._vptr_TestNode = (_func_int **)pCVar9;
      pTVar11->_vptr_TestNode = (_func_int **)&PTR__BlitFboCase_021b8178;
      pTVar11[1].m_testCtx = (TestContext *)0x100000000;
      pTVar11[1].m_description._M_dataplus._M_p = (pointer)0x0;
      pTVar11[1].m_description.field_2._M_allocated_capacity = 0;
      *(undefined8 *)&pTVar11[1].m_nodeType = 0;
      pTVar11[1].m_children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      pTVar11[2]._vptr_TestNode = (_func_int **)0x0;
      pTVar11[2].m_name._M_dataplus._M_p = (pointer)0x0;
      pTVar11[1].m_name._M_dataplus._M_p = (pointer)0x0;
      pTVar11[1].m_name._M_string_length = 0;
      *(undefined8 *)((long)&pTVar11[1].m_name._M_string_length + 4) = 0;
      *(undefined8 *)((long)&pTVar11[1].m_name.field_2 + 4) = 0;
      tcu::TestNode::addChild(pTVar10,pTVar11);
      pTVar11 = (TestNode *)operator_new(0x100);
      pCVar9 = (this->super_TestCaseGroup).m_context;
      tcu::TestCase::TestCase
                ((TestCase *)pTVar11,pCVar9->m_testCtx,"blit_fbo_to_default",
                 "Blit from fbo to default fb");
      pTVar11[1]._vptr_TestNode = (_func_int **)pCVar9;
      pTVar11->_vptr_TestNode = (_func_int **)&PTR__BlitFboCase_021b8178;
      *(undefined4 *)&pTVar11[1].m_testCtx = 1;
      pTVar11[1].m_description._M_dataplus._M_p = (pointer)0x0;
      pTVar11[1].m_description.field_2._M_allocated_capacity = 0;
      *(undefined8 *)&pTVar11[1].m_nodeType = 0;
      pTVar11[1].m_children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      pTVar11[2]._vptr_TestNode = (_func_int **)0x0;
      pTVar11[2].m_name._M_dataplus._M_p = (pointer)0x0;
      *(undefined8 *)((long)&pTVar11[1].m_testCtx + 4) = 0;
      *(undefined8 *)((long)&pTVar11[1].m_name._M_dataplus._M_p + 4) = 0;
      *(undefined8 *)((long)&pTVar11[1].m_name._M_string_length + 4) = 0;
      *(undefined8 *)((long)&pTVar11[1].m_name.field_2 + 4) = 0;
      tcu::TestNode::addChild(pTVar10,pTVar11);
      pTVar11 = (TestNode *)operator_new(0x100);
      pCVar9 = (this->super_TestCaseGroup).m_context;
      tcu::TestCase::TestCase
                ((TestCase *)pTVar11,pCVar9->m_testCtx,"blit_fbo_to_fbo","Blit from fbo to fbo");
      pTVar11[1]._vptr_TestNode = (_func_int **)pCVar9;
      pTVar11->_vptr_TestNode = (_func_int **)&PTR__BlitFboCase_021b8178;
      pTVar11[1].m_testCtx = (TestContext *)&DAT_100000001;
      pTVar11[1].m_description._M_dataplus._M_p = (pointer)0x0;
      pTVar11[1].m_description.field_2._M_allocated_capacity = 0;
      *(undefined8 *)&pTVar11[1].m_nodeType = 0;
      pTVar11[1].m_children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      pTVar11[2]._vptr_TestNode = (_func_int **)0x0;
      pTVar11[2].m_name._M_dataplus._M_p = (pointer)0x0;
      pTVar11[1].m_name._M_dataplus._M_p = (pointer)0x0;
      pTVar11[1].m_name._M_string_length = 0;
      *(undefined8 *)((long)&pTVar11[1].m_name._M_string_length + 4) = 0;
      *(undefined8 *)((long)&pTVar11[1].m_name.field_2 + 4) = 0;
      tcu::TestNode::addChild(pTVar10,pTVar11);
      pTVar10 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar10,
                 (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"clear",
                 "Test bounding box does not clears");
      tcu::TestNode::addChild((TestNode *)this,pTVar10);
      pTVar11 = (TestNode *)operator_new(0xe0);
      pCVar9 = (this->super_TestCaseGroup).m_context;
      tcu::TestCase::TestCase((TestCase *)pTVar11,pCVar9->m_testCtx,"full_clear","Do full clears");
      pTVar11[1]._vptr_TestNode = (_func_int **)pCVar9;
      pTVar11->_vptr_TestNode = (_func_int **)&PTR__ClearCase_021b81c8;
      *(undefined4 *)&pTVar11[1].m_testCtx = 0x1000000;
      pTVar11[1].m_name._M_dataplus._M_p = (pointer)0x0;
      pTVar11[1].m_name.field_2._M_allocated_capacity = 0;
      pTVar11[1].m_description._M_dataplus._M_p = (pointer)0x0;
      pTVar11[1].m_description.field_2._M_allocated_capacity = 0;
      *(undefined8 *)((long)&pTVar11[1].m_description.field_2 + 8) = 0;
      *(undefined8 *)&pTVar11[1].m_nodeType = 0;
      pTVar11[1].m_children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      pTVar11[1].m_children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      pTVar11[1].m_children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      tcu::TestNode::addChild(pTVar10,pTVar11);
      pTVar11 = (TestNode *)operator_new(0xe0);
      pCVar9 = (this->super_TestCaseGroup).m_context;
      tcu::TestCase::TestCase
                ((TestCase *)pTVar11,pCVar9->m_testCtx,"full_clear_with_triangles",
                 "Do full clears and render some geometry");
      pTVar11[1]._vptr_TestNode = (_func_int **)pCVar9;
      pTVar11->_vptr_TestNode = (_func_int **)&PTR__ClearCase_021b81c8;
      *(undefined4 *)&pTVar11[1].m_testCtx = 0x1010000;
      pTVar11[1].m_name._M_dataplus._M_p = (pointer)0x0;
      pTVar11[1].m_name.field_2._M_allocated_capacity = 0;
      pTVar11[1].m_description._M_dataplus._M_p = (pointer)0x0;
      pTVar11[1].m_description.field_2._M_allocated_capacity = 0;
      *(undefined8 *)((long)&pTVar11[1].m_description.field_2 + 8) = 0;
      *(undefined8 *)&pTVar11[1].m_nodeType = 0;
      pTVar11[1].m_children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      pTVar11[1].m_children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      pTVar11[1].m_children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      tcu::TestNode::addChild(pTVar10,pTVar11);
      pTVar11 = (TestNode *)operator_new(0xe0);
      pCVar9 = (this->super_TestCaseGroup).m_context;
      tcu::TestCase::TestCase
                ((TestCase *)pTVar11,pCVar9->m_testCtx,
                 "full_clear_with_triangles_per_primitive_bbox",
                 "Do full clears and render some geometry");
      pTVar11[1]._vptr_TestNode = (_func_int **)pCVar9;
      pTVar11->_vptr_TestNode = (_func_int **)&PTR__ClearCase_021b81c8;
      *(undefined4 *)&pTVar11[1].m_testCtx = 0x10000;
      pTVar11[1].m_name._M_dataplus._M_p = (pointer)0x0;
      pTVar11[1].m_name.field_2._M_allocated_capacity = 0;
      pTVar11[1].m_description._M_dataplus._M_p = (pointer)0x0;
      pTVar11[1].m_description.field_2._M_allocated_capacity = 0;
      *(undefined8 *)((long)&pTVar11[1].m_description.field_2 + 8) = 0;
      *(undefined8 *)&pTVar11[1].m_nodeType = 0;
      pTVar11[1].m_children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      pTVar11[1].m_children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      pTVar11[1].m_children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      tcu::TestNode::addChild(pTVar10,pTVar11);
      pTVar11 = (TestNode *)operator_new(0xe0);
      pCVar9 = (this->super_TestCaseGroup).m_context;
      tcu::TestCase::TestCase
                ((TestCase *)pTVar11,pCVar9->m_testCtx,"scissored_clear","Do scissored clears");
      pTVar11[1]._vptr_TestNode = (_func_int **)pCVar9;
      pTVar11->_vptr_TestNode = (_func_int **)&PTR__ClearCase_021b81c8;
      *(undefined4 *)&pTVar11[1].m_testCtx = 0x1000001;
      pTVar11[1].m_name._M_dataplus._M_p = (pointer)0x0;
      pTVar11[1].m_name.field_2._M_allocated_capacity = 0;
      pTVar11[1].m_description._M_dataplus._M_p = (pointer)0x0;
      pTVar11[1].m_description.field_2._M_allocated_capacity = 0;
      *(undefined8 *)((long)&pTVar11[1].m_description.field_2 + 8) = 0;
      *(undefined8 *)&pTVar11[1].m_nodeType = 0;
      pTVar11[1].m_children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      pTVar11[1].m_children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      pTVar11[1].m_children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      tcu::TestNode::addChild(pTVar10,pTVar11);
      pTVar11 = (TestNode *)operator_new(0xe0);
      pCVar9 = (this->super_TestCaseGroup).m_context;
      tcu::TestCase::TestCase
                ((TestCase *)pTVar11,pCVar9->m_testCtx,"scissored_clear_with_triangles",
                 "Do scissored clears and render some geometry");
      pTVar11[1]._vptr_TestNode = (_func_int **)pCVar9;
      pTVar11->_vptr_TestNode = (_func_int **)&PTR__ClearCase_021b81c8;
      *(undefined4 *)&pTVar11[1].m_testCtx = 0x1010001;
      pTVar11[1].m_name._M_dataplus._M_p = (pointer)0x0;
      pTVar11[1].m_name.field_2._M_allocated_capacity = 0;
      pTVar11[1].m_description._M_dataplus._M_p = (pointer)0x0;
      pTVar11[1].m_description.field_2._M_allocated_capacity = 0;
      *(undefined8 *)((long)&pTVar11[1].m_description.field_2 + 8) = 0;
      *(undefined8 *)&pTVar11[1].m_nodeType = 0;
      pTVar11[1].m_children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      pTVar11[1].m_children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      pTVar11[1].m_children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      tcu::TestNode::addChild(pTVar10,pTVar11);
      pTVar11 = (TestNode *)operator_new(0xe0);
      pCVar9 = (this->super_TestCaseGroup).m_context;
      tcu::TestCase::TestCase
                ((TestCase *)pTVar11,pCVar9->m_testCtx,
                 "scissored_clear_with_triangles_per_primitive_bbox",
                 "Do scissored clears and render some geometry");
      pTVar11[1]._vptr_TestNode = (_func_int **)pCVar9;
      pTVar11->_vptr_TestNode = (_func_int **)&PTR__ClearCase_021b81c8;
      *(undefined4 *)&pTVar11[1].m_testCtx = 0x10001;
      pTVar11[1].m_name._M_dataplus._M_p = (pointer)0x0;
      pTVar11[1].m_name.field_2._M_allocated_capacity = 0;
      pTVar11[1].m_description._M_dataplus._M_p = (pointer)0x0;
      pTVar11[1].m_description.field_2._M_allocated_capacity = 0;
      *(undefined8 *)((long)&pTVar11[1].m_description.field_2 + 8) = 0;
      *(undefined8 *)&pTVar11[1].m_nodeType = 0;
      pTVar11[1].m_children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      pTVar11[1].m_children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      pTVar11[1].m_children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      tcu::TestNode::addChild(pTVar10,pTVar11);
      pTVar11 = (TestNode *)operator_new(0xe0);
      pCVar9 = (this->super_TestCaseGroup).m_context;
      tcu::TestCase::TestCase
                ((TestCase *)pTVar11,pCVar9->m_testCtx,"scissored_full_clear",
                 "Do full clears with enabled scissor");
      pTVar11[1]._vptr_TestNode = (_func_int **)pCVar9;
      pTVar11->_vptr_TestNode = (_func_int **)&PTR__ClearCase_021b81c8;
      *(undefined4 *)&pTVar11[1].m_testCtx = 0x1000101;
      pTVar11[1].m_name._M_dataplus._M_p = (pointer)0x0;
      pTVar11[1].m_name.field_2._M_allocated_capacity = 0;
      pTVar11[1].m_description._M_dataplus._M_p = (pointer)0x0;
      pTVar11[1].m_description.field_2._M_allocated_capacity = 0;
      *(undefined8 *)((long)&pTVar11[1].m_description.field_2 + 8) = 0;
      *(undefined8 *)&pTVar11[1].m_nodeType = 0;
      pTVar11[1].m_children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      pTVar11[1].m_children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      pTVar11[1].m_children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      tcu::TestNode::addChild(pTVar10,pTVar11);
      pTVar11 = (TestNode *)operator_new(0xe0);
      pCVar9 = (this->super_TestCaseGroup).m_context;
      tcu::TestCase::TestCase
                ((TestCase *)pTVar11,pCVar9->m_testCtx,"scissored_full_clear_with_triangles",
                 "Do full clears with enabled scissor and render some geometry");
      pTVar11[1]._vptr_TestNode = (_func_int **)pCVar9;
      pTVar11->_vptr_TestNode = (_func_int **)&PTR__ClearCase_021b81c8;
      *(undefined4 *)&pTVar11[1].m_testCtx = 0x1010101;
      pTVar11[1].m_name._M_dataplus._M_p = (pointer)0x0;
      pTVar11[1].m_name.field_2._M_allocated_capacity = 0;
      pTVar11[1].m_description._M_dataplus._M_p = (pointer)0x0;
      pTVar11[1].m_description.field_2._M_allocated_capacity = 0;
      *(undefined8 *)((long)&pTVar11[1].m_description.field_2 + 8) = 0;
      *(undefined8 *)&pTVar11[1].m_nodeType = 0;
      pTVar11[1].m_children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      pTVar11[1].m_children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      pTVar11[1].m_children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      tcu::TestNode::addChild(pTVar10,pTVar11);
      pTVar11 = (TestNode *)operator_new(0xe0);
      pCVar9 = (this->super_TestCaseGroup).m_context;
      tcu::TestCase::TestCase
                ((TestCase *)pTVar11,pCVar9->m_testCtx,
                 "scissored_full_clear_with_triangles_per_primitive_bbox",
                 "Do full clears with enabled scissor and render some geometry");
      pTVar11[1]._vptr_TestNode = (_func_int **)pCVar9;
      pTVar11->_vptr_TestNode = (_func_int **)&PTR__ClearCase_021b81c8;
      *(undefined4 *)&pTVar11[1].m_testCtx = 0x10101;
      pTVar11[1].m_name._M_dataplus._M_p = (pointer)0x0;
      pTVar11[1].m_name.field_2._M_allocated_capacity = 0;
      pTVar11[1].m_description._M_dataplus._M_p = (pointer)0x0;
      pTVar11[1].m_description.field_2._M_allocated_capacity = 0;
      *(undefined8 *)((long)&pTVar11[1].m_description.field_2 + 8) = 0;
      *(undefined8 *)&pTVar11[1].m_nodeType = 0;
      pTVar11[1].m_children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      pTVar11[1].m_children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      pTVar11[1].m_children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      tcu::TestNode::addChild(pTVar10,pTVar11);
      pTVar10 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar10,
                 (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                 "call_order","Test viewport and bounding box calls have no effect");
      tcu::TestNode::addChild((TestNode *)this,pTVar10);
      pTVar11 = (TestNode *)operator_new(0xa8);
      pCVar9 = (this->super_TestCaseGroup).m_context;
      tcu::TestCase::TestCase
                ((TestCase *)pTVar11,pCVar9->m_testCtx,"viewport_first_bbox_second",
                 "Set up viewport first and bbox after");
      pTVar11[1]._vptr_TestNode = (_func_int **)pCVar9;
      pTVar11->_vptr_TestNode = (_func_int **)&PTR__ViewportCallOrderCase_021b8218;
      *(undefined4 *)&pTVar11[1].m_testCtx = 0;
      pTVar11[1].m_name._M_dataplus._M_p = (pointer)0x0;
      pTVar11[1].m_name.field_2._M_allocated_capacity = 0;
      *(undefined4 *)&pTVar11[1].m_description._M_dataplus._M_p = 0xffffffff;
      tcu::TestNode::addChild(pTVar10,pTVar11);
      pTVar11 = (TestNode *)operator_new(0xa8);
      pCVar9 = (this->super_TestCaseGroup).m_context;
      tcu::TestCase::TestCase
                ((TestCase *)pTVar11,pCVar9->m_testCtx,"bbox_first_viewport_second",
                 "Set up bbox first and viewport after");
      pTVar11[1]._vptr_TestNode = (_func_int **)pCVar9;
      pTVar11->_vptr_TestNode = (_func_int **)&PTR__ViewportCallOrderCase_021b8218;
      *(undefined4 *)&pTVar11[1].m_testCtx = 1;
      pTVar11[1].m_name._M_dataplus._M_p = (pointer)0x0;
      pTVar11[1].m_name.field_2._M_allocated_capacity = 0;
      *(undefined4 *)&pTVar11[1].m_description._M_dataplus._M_p = 0xffffffff;
      tcu::TestNode::addChild(pTVar10,pTVar11);
      return extraout_EAX;
    }
  } while( true );
}

Assistant:

void PrimitiveBoundingBoxTests::init (void)
{
	static const struct
	{
		const char*	name;
		const char*	description;
		deUint32	methodFlags;
	} stateSetMethods[] =
	{
		{
			"global_state",
			"Set bounding box using PRIMITIVE_BOUNDING_BOX_EXT state",
			BBoxRenderCase::FLAG_SET_BBOX_STATE,
		},
		{
			"tessellation_set_per_draw",
			"Set bounding box using gl_BoundingBoxEXT, use same value for all primitives",
			BBoxRenderCase::FLAG_SET_BBOX_OUTPUT,
		},
		{
			"tessellation_set_per_primitive",
			"Set bounding box using gl_BoundingBoxEXT, use per-primitive bounding box",
			BBoxRenderCase::FLAG_SET_BBOX_OUTPUT | BBoxRenderCase::FLAG_PER_PRIMITIVE_BBOX,
		},
	};
	static const struct
	{
		const char*	name;
		const char*	description;
		deUint32	stageFlags;
	} pipelineConfigs[] =
	{
		{
			"vertex_fragment",
			"Render with vertex-fragment program",
			0u
		},
		{
			"vertex_tessellation_fragment",
			"Render with vertex-tessellation{ctrl,eval}-fragment program",
			BBoxRenderCase::FLAG_TESSELLATION
		},
		{
			"vertex_geometry_fragment",
			"Render with vertex-tessellation{ctrl,eval}-geometry-fragment program",
			BBoxRenderCase::FLAG_GEOMETRY
		},
		{
			"vertex_tessellation_geometry_fragment",
			"Render with vertex-geometry-fragment program",
			BBoxRenderCase::FLAG_TESSELLATION | BBoxRenderCase::FLAG_GEOMETRY
		},
	};
	static const struct
	{
		const char*	name;
		const char*	description;
		deUint32	flags;
		deUint32	invalidFlags;
		deUint32	requiredFlags;
	} usageConfigs[] =
	{
		{
			"default_framebuffer_bbox_equal",
			"Render to default framebuffer, set tight bounding box",
			BBoxRenderCase::FLAG_RENDERTARGET_DEFAULT | BBoxRenderCase::FLAG_BBOXSIZE_EQUAL,
			BBoxRenderCase::FLAG_PER_PRIMITIVE_BBOX,
			0
		},
		{
			"default_framebuffer_bbox_larger",
			"Render to default framebuffer, set padded bounding box",
			BBoxRenderCase::FLAG_RENDERTARGET_DEFAULT | BBoxRenderCase::FLAG_BBOXSIZE_LARGER,
			BBoxRenderCase::FLAG_PER_PRIMITIVE_BBOX,
			0
		},
		{
			"default_framebuffer_bbox_smaller",
			"Render to default framebuffer, set too small bounding box",
			BBoxRenderCase::FLAG_RENDERTARGET_DEFAULT | BBoxRenderCase::FLAG_BBOXSIZE_SMALLER,
			BBoxRenderCase::FLAG_PER_PRIMITIVE_BBOX,
			0
		},
		{
			"fbo_bbox_equal",
			"Render to texture, set tight bounding box",
			BBoxRenderCase::FLAG_RENDERTARGET_FBO | BBoxRenderCase::FLAG_BBOXSIZE_EQUAL,
			BBoxRenderCase::FLAG_PER_PRIMITIVE_BBOX,
			0
		},
		{
			"fbo_bbox_larger",
			"Render to texture, set padded bounding box",
			BBoxRenderCase::FLAG_RENDERTARGET_FBO | BBoxRenderCase::FLAG_BBOXSIZE_LARGER,
			BBoxRenderCase::FLAG_PER_PRIMITIVE_BBOX,
			0
		},
		{
			"fbo_bbox_smaller",
			"Render to texture, set too small bounding box",
			BBoxRenderCase::FLAG_RENDERTARGET_FBO | BBoxRenderCase::FLAG_BBOXSIZE_SMALLER,
			BBoxRenderCase::FLAG_PER_PRIMITIVE_BBOX,
			0
		},
		{
			"default_framebuffer",
			"Render to default framebuffer, set tight bounding box",
			BBoxRenderCase::FLAG_RENDERTARGET_DEFAULT | BBoxRenderCase::FLAG_BBOXSIZE_EQUAL,
			0,
			BBoxRenderCase::FLAG_PER_PRIMITIVE_BBOX
		},
		{
			"fbo",
			"Render to texture, set tight bounding box",
			BBoxRenderCase::FLAG_RENDERTARGET_FBO | BBoxRenderCase::FLAG_BBOXSIZE_EQUAL,
			0,
			BBoxRenderCase::FLAG_PER_PRIMITIVE_BBOX
		},
	};
	enum PrimitiveRenderType
	{
		TYPE_TRIANGLE,
		TYPE_LINE,
		TYPE_POINT,
	};
	const struct
	{
		const char*			name;
		const char*			description;
		PrimitiveRenderType	type;
		deUint32			flags;
	} primitiveTypes[] =
	{
		{
			"triangles",
			"Triangle render tests",
			TYPE_TRIANGLE,
			0
		},
		{
			"lines",
			"Line render tests",
			TYPE_LINE,
			0
		},
		{
			"points",
			"Point render tests",
			TYPE_POINT,
			0
		},
		{
			"wide_lines",
			"Wide line render tests",
			TYPE_LINE,
			LineRenderCase::LINEFLAG_WIDE
		},
		{
			"wide_points",
			"Wide point render tests",
			TYPE_POINT,
			PointRenderCase::POINTFLAG_WIDE
		},
	};

	// .state_query
	{
		tcu::TestCaseGroup* const stateQueryGroup = new tcu::TestCaseGroup(m_testCtx, "state_query", "State queries");
		addChild(stateQueryGroup);

		stateQueryGroup->addChild(new InitialValueCase	(m_context,	"initial_value",	"Initial value case"));
		stateQueryGroup->addChild(new QueryCase			(m_context,	"getfloat",			"getFloatv",			QueryCase::QUERY_FLOAT));
		stateQueryGroup->addChild(new QueryCase			(m_context,	"getboolean",		"getBooleanv",			QueryCase::QUERY_BOOLEAN));
		stateQueryGroup->addChild(new QueryCase			(m_context,	"getinteger",		"getIntegerv",			QueryCase::QUERY_INT));
		stateQueryGroup->addChild(new QueryCase			(m_context,	"getinteger64",		"getInteger64v",		QueryCase::QUERY_INT64));
	}

	// .triangles
	// .(wide_)lines
	// .(wide_)points
	for (int primitiveTypeNdx = 0; primitiveTypeNdx < DE_LENGTH_OF_ARRAY(primitiveTypes); ++primitiveTypeNdx)
	{
		tcu::TestCaseGroup* const primitiveGroup = new tcu::TestCaseGroup(m_testCtx, primitiveTypes[primitiveTypeNdx].name, primitiveTypes[primitiveTypeNdx].description);
		addChild(primitiveGroup);

		for (int stateSetMethodNdx = 0; stateSetMethodNdx < DE_LENGTH_OF_ARRAY(stateSetMethods); ++stateSetMethodNdx)
		{
			tcu::TestCaseGroup* const methodGroup = new tcu::TestCaseGroup(m_testCtx, stateSetMethods[stateSetMethodNdx].name, stateSetMethods[stateSetMethodNdx].description);
			primitiveGroup->addChild(methodGroup);

			for (int pipelineConfigNdx = 0; pipelineConfigNdx < DE_LENGTH_OF_ARRAY(pipelineConfigs); ++pipelineConfigNdx)
			{
				if ((stateSetMethods[stateSetMethodNdx].methodFlags & BBoxRenderCase::FLAG_SET_BBOX_OUTPUT) != 0 &&
					(pipelineConfigs[pipelineConfigNdx].stageFlags  & BBoxRenderCase::FLAG_TESSELLATION)    == 0)
				{
					// invalid config combination
				}
				else
				{
					tcu::TestCaseGroup* const pipelineGroup = new tcu::TestCaseGroup(m_testCtx, pipelineConfigs[pipelineConfigNdx].name, pipelineConfigs[pipelineConfigNdx].description);
					methodGroup->addChild(pipelineGroup);

					for (int usageNdx = 0; usageNdx < DE_LENGTH_OF_ARRAY(usageConfigs); ++usageNdx)
					{
						const deUint32 flags = primitiveTypes[primitiveTypeNdx].flags         |
											   stateSetMethods[stateSetMethodNdx].methodFlags |
											   pipelineConfigs[pipelineConfigNdx].stageFlags  |
											   usageConfigs[usageNdx].flags;

						if (usageConfigs[usageNdx].invalidFlags && (flags & usageConfigs[usageNdx].invalidFlags) != 0)
							continue;
						if (usageConfigs[usageNdx].requiredFlags && (flags & usageConfigs[usageNdx].requiredFlags) == 0)
							continue;

						switch (primitiveTypes[primitiveTypeNdx].type)
						{
							case TYPE_TRIANGLE:
								pipelineGroup->addChild(new GridRenderCase(m_context, usageConfigs[usageNdx].name, usageConfigs[usageNdx].description, flags));
								break;
							case TYPE_LINE:
								pipelineGroup->addChild(new LineRenderCase(m_context, usageConfigs[usageNdx].name, usageConfigs[usageNdx].description, flags));
								break;
							case TYPE_POINT:
								pipelineGroup->addChild(new PointRenderCase(m_context, usageConfigs[usageNdx].name, usageConfigs[usageNdx].description, flags));
								break;
							default:
								DE_ASSERT(false);
						}
					}
				}
			}
		}
	}

	// .depth
	{
		static const struct
		{
			const char*					name;
			const char*					description;
			DepthDrawCase::DepthType	depthMethod;
		} depthMethods[] =
		{
			{
				"builtin_depth",
				"Fragment depth not modified in fragment shader",
				DepthDrawCase::DEPTH_BUILTIN
			},
			{
				"user_defined_depth",
				"Fragment depth is defined in the fragment shader",
				DepthDrawCase::DEPTH_USER_DEFINED
			},
		};
		static const struct
		{
			const char*					name;
			const char*					description;
			DepthDrawCase::BBoxState	bboxState;
			DepthDrawCase::BBoxSize		bboxSize;
		} depthCases[] =
		{
			{
				"global_state_bbox_equal",
				"Test tight bounding box with global bbox state",
				DepthDrawCase::STATE_GLOBAL,
				DepthDrawCase::BBOX_EQUAL,
			},
			{
				"global_state_bbox_larger",
				"Test padded bounding box with global bbox state",
				DepthDrawCase::STATE_GLOBAL,
				DepthDrawCase::BBOX_LARGER,
			},
			{
				"per_primitive_bbox_equal",
				"Test tight bounding box with tessellation output bbox",
				DepthDrawCase::STATE_PER_PRIMITIVE,
				DepthDrawCase::BBOX_EQUAL,
			},
			{
				"per_primitive_bbox_larger",
				"Test padded bounding box with tessellation output bbox",
				DepthDrawCase::STATE_PER_PRIMITIVE,
				DepthDrawCase::BBOX_LARGER,
			},
		};

		tcu::TestCaseGroup* const depthGroup = new tcu::TestCaseGroup(m_testCtx, "depth", "Test bounding box depth component");
		addChild(depthGroup);

		// .builtin_depth
		// .user_defined_depth
		for (int depthNdx = 0; depthNdx < DE_LENGTH_OF_ARRAY(depthMethods); ++depthNdx)
		{
			tcu::TestCaseGroup* const group = new tcu::TestCaseGroup(m_testCtx, depthMethods[depthNdx].name, depthMethods[depthNdx].description);
			depthGroup->addChild(group);

			for (int caseNdx = 0; caseNdx < DE_LENGTH_OF_ARRAY(depthCases); ++caseNdx)
				group->addChild(new DepthDrawCase(m_context, depthCases[caseNdx].name, depthCases[caseNdx].description, depthMethods[depthNdx].depthMethod, depthCases[caseNdx].bboxState, depthCases[caseNdx].bboxSize));
		}
	}

	// .blit_fbo
	{
		tcu::TestCaseGroup* const blitFboGroup = new tcu::TestCaseGroup(m_testCtx, "blit_fbo", "Test bounding box does not affect blitting");
		addChild(blitFboGroup);

		blitFboGroup->addChild(new BlitFboCase(m_context, "blit_default_to_fbo", "Blit from default fb to fbo", BlitFboCase::TARGET_DEFAULT, BlitFboCase::TARGET_FBO));
		blitFboGroup->addChild(new BlitFboCase(m_context, "blit_fbo_to_default", "Blit from fbo to default fb", BlitFboCase::TARGET_FBO,     BlitFboCase::TARGET_DEFAULT));
		blitFboGroup->addChild(new BlitFboCase(m_context, "blit_fbo_to_fbo",     "Blit from fbo to fbo",        BlitFboCase::TARGET_FBO,     BlitFboCase::TARGET_FBO));
	}

	// .clear
	{
		tcu::TestCaseGroup* const clearGroup = new tcu::TestCaseGroup(m_testCtx, "clear", "Test bounding box does not clears");
		addChild(clearGroup);

		clearGroup->addChild(new ClearCase(m_context, "full_clear",                                             "Do full clears",                                               0));
		clearGroup->addChild(new ClearCase(m_context, "full_clear_with_triangles",                              "Do full clears and render some geometry",                      ClearCase::DRAW_TRIANGLE_BIT));
		clearGroup->addChild(new ClearCase(m_context, "full_clear_with_triangles_per_primitive_bbox",           "Do full clears and render some geometry",                      ClearCase::DRAW_TRIANGLE_BIT | ClearCase::PER_PRIMITIVE_BBOX_BIT));
		clearGroup->addChild(new ClearCase(m_context, "scissored_clear",                                        "Do scissored clears",                                          ClearCase::SCISSOR_CLEAR_BIT));
		clearGroup->addChild(new ClearCase(m_context, "scissored_clear_with_triangles",                         "Do scissored clears and render some geometry",                 ClearCase::SCISSOR_CLEAR_BIT | ClearCase::DRAW_TRIANGLE_BIT));
		clearGroup->addChild(new ClearCase(m_context, "scissored_clear_with_triangles_per_primitive_bbox",      "Do scissored clears and render some geometry",                 ClearCase::SCISSOR_CLEAR_BIT | ClearCase::DRAW_TRIANGLE_BIT | ClearCase::PER_PRIMITIVE_BBOX_BIT));
		clearGroup->addChild(new ClearCase(m_context, "scissored_full_clear",                                   "Do full clears with enabled scissor",                          ClearCase::FULLSCREEN_SCISSOR_BIT | ClearCase::SCISSOR_CLEAR_BIT));
		clearGroup->addChild(new ClearCase(m_context, "scissored_full_clear_with_triangles",                    "Do full clears with enabled scissor and render some geometry", ClearCase::FULLSCREEN_SCISSOR_BIT | ClearCase::SCISSOR_CLEAR_BIT | ClearCase::DRAW_TRIANGLE_BIT));
		clearGroup->addChild(new ClearCase(m_context, "scissored_full_clear_with_triangles_per_primitive_bbox", "Do full clears with enabled scissor and render some geometry", ClearCase::FULLSCREEN_SCISSOR_BIT | ClearCase::SCISSOR_CLEAR_BIT | ClearCase::DRAW_TRIANGLE_BIT | ClearCase::PER_PRIMITIVE_BBOX_BIT));
	}

	// .call_order (Khronos bug #13262)
	{
		tcu::TestCaseGroup* const callOrderGroup = new tcu::TestCaseGroup(m_testCtx, "call_order", "Test viewport and bounding box calls have no effect");
		addChild(callOrderGroup);

		callOrderGroup->addChild(new ViewportCallOrderCase(m_context, "viewport_first_bbox_second", "Set up viewport first and bbox after", ViewportCallOrderCase::VIEWPORT_FIRST));
		callOrderGroup->addChild(new ViewportCallOrderCase(m_context, "bbox_first_viewport_second", "Set up bbox first and viewport after", ViewportCallOrderCase::BBOX_FIRST));
	}
}